

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

node * node_create(void *data)

{
  node *pnVar1;
  
  pnVar1 = (node *)malloc(0x18);
  if (pnVar1 == (node *)0x0) {
    pnVar1 = (node *)0x0;
  }
  else {
    pnVar1->next = (node *)0x0;
    pnVar1->previous = (node *)0x0;
    pnVar1->data = data;
  }
  return pnVar1;
}

Assistant:

struct node *node_create(const void *data)
{
        struct node *node = malloc(sizeof(struct node));

        if (node == NULL) {
                return NULL;
        }

        node->next = NULL;
        node->previous = NULL;
        node->data = data;

        return node;
}